

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_copy_prime2img(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  int *in_RDX;
  int in_stack_00000008;
  int in_stack_0000000c;
  char *(*in_stack_00000010) [2];
  int in_stack_0000001c;
  char *spkeys [13] [2];
  int nsp;
  undefined1 local_f8 [212];
  undefined4 local_24;
  int *local_20;
  int local_4;
  
  local_20 = in_RDX;
  memcpy(local_f8,&DAT_002c6860,0xd0);
  if (*local_20 < 1) {
    local_24 = 0xd;
    fits_translate_keywords
              ((fitsfile *)spkeys[0][1],(fitsfile *)spkeys[0][0],in_stack_0000001c,in_stack_00000010
               ,in_stack_0000000c,in_stack_00000008,(int)spkeys[4][0],(int)spkeys[4][1],
               (int *)spkeys[5][0]);
    local_4 = *local_20;
  }
  else {
    local_4 = *local_20;
  }
  return local_4;
}

Assistant:

int imcomp_copy_prime2img(fitsfile *infptr, fitsfile *outfptr, int *status)
/*
    This routine copies any unexpected keywords from the primary array
    of the compressed input image into the header of the uncompressed image
    (which is the primary array of the output file). 
*/
{
    int  nsp;

    /* keywords that will not be copied */
    char *spkeys[][2] = {
			   {"SIMPLE", "-"      },
			   {"BITPIX",  "-"       },
			   {"NAXIS",   "-"       },
			   {"NAXISm",  "-"       },
			   {"PCOUNT",  "-"       },
			   {"EXTEND",  "-"       },
			   {"GCOUNT",  "-"       },
			   {"CHECKSUM","-"       }, 
			   {"DATASUM", "-"       },
			   {"EXTNAME", "-"       },
			   {"HISTORY", "-"       },
			   {"COMMENT", "-"       },
			   {"*",       "+"      }};  

    if (*status > 0)
        return(*status);
	
    nsp = sizeof(spkeys)/sizeof(spkeys[0][0])/2;

    /* translate and copy the keywords from the input file to the output */
    fits_translate_keywords(infptr, outfptr, 1, spkeys, nsp,
			    0, 0, 0, status);

    return (*status);
}